

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LE_EulerAngles.cpp
# Opt level: O0

LE_EulerAngles * __thiscall
KDIS::DATA_TYPE::LE_EulerAngles::operator*
          (LE_EulerAngles *__return_storage_ptr__,LE_EulerAngles *this,KFLOAT64 Value)

{
  KFIXED<char,_(unsigned_char)__x03_> local_98;
  KFIXED<char,_(unsigned_char)__x03_> local_88;
  KFIXED<char,_(unsigned_char)__x03_> local_78;
  KFIXED<char,_(unsigned_char)__x03_> local_68 [2];
  KFIXED<char,_(unsigned_char)__x03_> local_48;
  KFIXED<char,_(unsigned_char)__x03_> local_38;
  undefined1 local_21;
  KFLOAT64 local_20;
  KFLOAT64 Value_local;
  LE_EulerAngles *this_local;
  LE_EulerAngles *tmp;
  
  local_21 = 0;
  local_20 = Value;
  Value_local = (KFLOAT64)this;
  this_local = __return_storage_ptr__;
  LE_EulerAngles(__return_storage_ptr__,this);
  KFIXED<char,_(unsigned_char)'\x03'>::operator*(&local_48,local_20);
  KFIXED<char,_(unsigned_char)'\x03'>::operator=(&local_38,&__return_storage_ptr__->m_Psi);
  KFIXED<char,_(unsigned_char)'\x03'>::~KFIXED(&local_38);
  KFIXED<char,_(unsigned_char)'\x03'>::~KFIXED(&local_48);
  KFIXED<char,_(unsigned_char)'\x03'>::operator*(&local_78,local_20);
  KFIXED<char,_(unsigned_char)'\x03'>::operator=(local_68,&__return_storage_ptr__->m_Theta);
  KFIXED<char,_(unsigned_char)'\x03'>::~KFIXED(local_68);
  KFIXED<char,_(unsigned_char)'\x03'>::~KFIXED(&local_78);
  KFIXED<char,_(unsigned_char)'\x03'>::operator*(&local_98,local_20);
  KFIXED<char,_(unsigned_char)'\x03'>::operator=(&local_88,&__return_storage_ptr__->m_Phi);
  KFIXED<char,_(unsigned_char)'\x03'>::~KFIXED(&local_88);
  KFIXED<char,_(unsigned_char)'\x03'>::~KFIXED(&local_98);
  return __return_storage_ptr__;
}

Assistant:

LE_EulerAngles KDIS::DATA_TYPE::LE_EulerAngles::operator * ( KFLOAT64 Value ) const
{
    LE_EulerAngles tmp = *this;
    tmp.m_Psi   = tmp.m_Psi * Value;
    tmp.m_Theta = tmp.m_Theta * Value;
    tmp.m_Phi   = tmp.m_Phi * Value;
    return tmp;
}